

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_ldm.c
# Opt level: O2

size_t ZSTD_ldm_generateSequences
                 (ldmState_t *ldmState,rawSeqStore_t *sequences,ldmParams_t *params,void *src,
                 size_t srcSize)

{
  BYTE **ppBVar1;
  byte *pbVar2;
  byte *pInLimit;
  U32 *pUVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  U32 UVar6;
  U32 UVar7;
  ulong uVar8;
  U64 UVar9;
  rawSeq *prVar10;
  undefined4 uVar11;
  ldmParams_t ldmParams;
  U32 UVar12;
  U32 i;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  U32 UVar16;
  BYTE *pBVar17;
  ulong uVar18;
  byte *pbVar19;
  size_t sVar20;
  size_t sVar21;
  long lVar22;
  U32 hbits;
  byte *pIn;
  BYTE *pBase;
  BYTE *pBVar23;
  byte *pbVar24;
  byte *pInLimit_00;
  size_t sVar25;
  byte *pAnchor;
  ulong uVar26;
  ldmEntry_t *plVar27;
  uint uVar28;
  uint uVar29;
  U32 offset;
  long lVar30;
  BYTE *pBase_00;
  U32 UVar31;
  ulong uVar32;
  ldmEntry_t *plVar33;
  byte *pbVar34;
  void *pvVar35;
  U64 hash;
  BYTE *pBVar36;
  size_t sStackY_1c0;
  size_t local_180;
  int iStack_13c;
  size_t local_c0;
  ldmEntry_t *local_b8;
  ulong local_a0;
  
  uVar13 = 1 << ((byte)params->windowLog & 0x1f);
  lVar22 = 0;
  sVar25 = 0;
  pvVar35 = src;
LAB_00157408:
  if ((lVar22 == ((srcSize >> 0x14) + 1) - (ulong)((srcSize & 0xfffff) == 0)) ||
     (uVar8 = sequences->size, sequences->capacity <= uVar8)) {
    return 0;
  }
  pbVar2 = (byte *)((long)src + lVar22 * 0x100000);
  pbVar34 = pbVar2 + 0x100000;
  if (srcSize + lVar22 * -0x100000 < 0x100000) {
    pbVar34 = (byte *)((long)src + srcSize);
  }
  pBVar23 = (ldmState->window).base;
  uVar14 = (int)pbVar34 - (int)pBVar23;
  if (0xe0000000 < uVar14) {
    UVar12 = params->hashLog;
    uVar14 = ((int)src - (int)pBVar23) - uVar13;
    (ldmState->window).base = pBVar23 + uVar14;
    ppBVar1 = &(ldmState->window).dictBase;
    *ppBVar1 = *ppBVar1 + uVar14;
    uVar4 = (ldmState->window).dictLimit;
    uVar5 = (ldmState->window).lowLimit;
    (ldmState->window).dictLimit = uVar4 - uVar14;
    (ldmState->window).lowLimit = uVar5 - uVar14;
    plVar27 = ldmState->hashTable;
    for (lVar30 = 0; 1L << ((byte)UVar12 & 0x3f) != lVar30; lVar30 = lVar30 + 1) {
      uVar15 = plVar27[lVar30].offset;
      UVar31 = uVar15 - uVar14;
      if (uVar15 < uVar14) {
        UVar31 = 0;
      }
      plVar27[lVar30].offset = UVar31;
    }
    pBVar23 = (ldmState->window).base;
    uVar14 = (int)pbVar34 - (int)pBVar23;
  }
  uVar15 = uVar14 - uVar13;
  if (uVar14 < uVar13 || uVar15 == 0) {
    uVar14 = (ldmState->window).dictLimit;
    uVar28 = (ldmState->window).lowLimit;
  }
  else {
    uVar28 = (ldmState->window).lowLimit;
    if (uVar28 < uVar15) {
      (ldmState->window).lowLimit = uVar15;
      uVar28 = uVar15;
    }
    uVar14 = (ldmState->window).dictLimit;
    if (uVar14 < uVar28) {
      (ldmState->window).dictLimit = uVar28;
      uVar14 = uVar28;
    }
  }
  UVar12 = params->bucketSizeLog;
  UVar31 = params->hashEveryLog;
  UVar6 = params->hashLog;
  uVar15 = params->minMatchLength;
  uVar32 = (ulong)uVar15;
  UVar9 = ldmState->hashPower;
  if (uVar28 < uVar14) {
    pBVar17 = (ldmState->window).dictBase;
    uVar29 = uVar28;
  }
  else {
    pBVar17 = (BYTE *)0x0;
    uVar29 = uVar14;
  }
  hbits = UVar6 - UVar12;
  pBase_00 = pBVar23 + uVar14;
  uVar18 = 8;
  if (8 < uVar15) {
    uVar18 = (ulong)uVar15;
  }
  pInLimit = pbVar2 + ((long)pbVar34 - (long)pbVar2);
  hash = 0;
  pIn = (byte *)0x0;
  pAnchor = pbVar2;
LAB_0015762a:
  offset = (1 - (int)pBVar23) + (int)pAnchor;
  pbVar19 = pIn;
  pIn = pAnchor;
  pbVar24 = pAnchor;
  do {
    pbVar24 = pbVar24 + 1;
    if (pInLimit + -uVar18 < pIn) {
      sStackY_1c0 = (long)pbVar34 - (long)pAnchor;
      goto LAB_00157b81;
    }
    if (pIn == pbVar2) {
      hash = 0;
      for (uVar26 = 0; uVar32 != uVar26; uVar26 = uVar26 + 1) {
        hash = hash * -0x30e44323485a9b9d + (ulong)*(byte *)((long)pvVar35 + uVar26) + 10;
      }
    }
    else {
      hash = (hash - ((ulong)*pbVar19 + 10) * UVar9) * -0x30e44323485a9b9d + (ulong)pbVar19[uVar32]
             + 10;
    }
    UVar16 = ZSTD_ldm_getTag(hash,hbits,UVar31);
    if ((UVar16 ^ -1 << ((byte)UVar31 & 0x1f)) == 0xffffffff) {
      UVar16 = (int)pIn - (int)pBVar23;
      uVar26 = hash >> (0x40U - (char)hbits & 0x3f) & 0xffffffff;
      if (UVar6 == UVar12) {
        uVar26 = 0;
      }
      plVar27 = ldmState->hashTable + (uVar26 << ((byte)params->bucketSizeLog & 0x3f));
      plVar33 = plVar27 + (1L << ((byte)UVar12 & 0x3f));
      local_a0 = 0;
      local_b8 = (ldmEntry_t *)0x0;
      local_c0 = 0;
      local_180 = 0;
      for (; plVar27 < plVar33; plVar27 = plVar27 + 1) {
        if (plVar27->checksum == (U32)(hash >> (0x20U - (char)hbits & 0x3f))) {
          uVar15 = plVar27->offset;
          if (uVar29 < uVar15) {
            if (uVar28 < uVar14) {
              pBVar36 = pBVar17;
              pbVar19 = pBVar17 + uVar14;
              if (uVar14 <= uVar15) {
                pBVar36 = pBVar23;
                pbVar19 = pInLimit;
              }
              pBVar36 = pBVar36 + uVar15;
              pInLimit_00 = pIn + ((long)pbVar19 - (long)pBVar36);
              if (pbVar34 <= pIn + ((long)pbVar19 - (long)pBVar36)) {
                pInLimit_00 = pInLimit;
              }
              sVar20 = ZSTD_count(pIn,pBVar36,pInLimit_00);
              if (pBVar36 + sVar20 == pbVar19) {
                sVar21 = ZSTD_count(pIn + sVar20,pBase_00,pInLimit);
                sVar20 = sVar20 + sVar21;
              }
              if (uVar32 <= sVar20) {
                pBase = pBVar17 + uVar29;
                if (uVar14 <= uVar15) {
                  pBase = pBase_00;
                }
                sVar21 = ZSTD_ldm_countBackwardsMatch(pIn,pAnchor,pBVar36,pBase);
                uVar26 = sVar21 + sVar20;
LAB_001578c7:
                if (local_a0 < uVar26) {
                  local_180 = sVar20;
                  local_c0 = sVar21;
                  local_b8 = plVar27;
                  local_a0 = uVar26;
                }
              }
            }
            else {
              sVar20 = ZSTD_count(pIn,pBVar23 + uVar15,pInLimit);
              if (uVar32 <= sVar20) {
                sVar21 = ZSTD_ldm_countBackwardsMatch(pIn,pAnchor,pBVar23 + uVar15,pBase_00);
                uVar26 = sVar21 + sVar20;
                goto LAB_001578c7;
              }
            }
          }
        }
      }
      if (local_b8 != (ldmEntry_t *)0x0) break;
      ZSTD_ldm_makeEntryAndInsertByTag(ldmState,hash,hbits,UVar16,*params);
    }
    offset = offset + 1;
    pbVar19 = pIn;
    pIn = pIn + 1;
  } while( true );
  sVar20 = sequences->size;
  if (sVar20 != sequences->capacity) {
    prVar10 = sequences->seq;
    UVar7 = local_b8->offset;
    prVar10[sVar20].litLength = ((int)pIn - (int)local_c0) - (int)pAnchor;
    prVar10[sVar20].matchLength = (int)local_c0 + (int)local_180;
    prVar10[sVar20].offset = UVar16 - UVar7;
    sequences->size = sVar20 + 1;
    ZSTD_ldm_makeEntryAndInsertByTag(ldmState,hash,hbits,UVar16,*params);
    pAnchor = pIn + local_180;
    if (pAnchor <= pInLimit + -uVar18) {
      uVar11 = params->minMatchLength;
      ldmParams = *params;
      for (; pbVar24 < pAnchor; pbVar24 = pbVar24 + 1) {
        hash = (hash - ((ulong)pbVar24[-1] + 10) * ldmState->hashPower) * -0x30e44323485a9b9d +
               (ulong)pbVar24[uVar11 - 1] + 10;
        ZSTD_ldm_makeEntryAndInsertByTag(ldmState,hash,hbits,offset,ldmParams);
        offset = offset + 1;
      }
      pIn = pAnchor + -1;
    }
    goto LAB_0015762a;
  }
  sStackY_1c0 = 0xffffffffffffffba;
LAB_00157b81:
  uVar14 = ZSTD_isError(sStackY_1c0);
  if (uVar14 != 0) {
    return sStackY_1c0;
  }
  if (uVar8 < sequences->size) {
    pUVar3 = &sequences->seq[uVar8].litLength;
    *pUVar3 = *pUVar3 + (int)sVar25;
  }
  else {
    sStackY_1c0 = ((long)pbVar34 - (long)pbVar2) + sVar25;
  }
  lVar22 = lVar22 + 1;
  pvVar35 = (void *)((long)pvVar35 + 0x100000);
  sVar25 = sStackY_1c0;
  goto LAB_00157408;
}

Assistant:

size_t ZSTD_ldm_generateSequences(
        ldmState_t* ldmState, rawSeqStore_t* sequences,
        ldmParams_t const* params, void const* src, size_t srcSize)
{
    U32 const maxDist = 1U << params->windowLog;
    BYTE const* const istart = (BYTE const*)src;
    BYTE const* const iend = istart + srcSize;
    size_t const kMaxChunkSize = 1 << 20;
    size_t const nbChunks = (srcSize / kMaxChunkSize) + ((srcSize % kMaxChunkSize) != 0);
    size_t chunk;
    size_t leftoverSize = 0;

    assert(ZSTD_CHUNKSIZE_MAX >= kMaxChunkSize);
    /* Check that ZSTD_window_update() has been called for this chunk prior
     * to passing it to this function.
     */
    assert(ldmState->window.nextSrc >= (BYTE const*)src + srcSize);
    /* The input could be very large (in zstdmt), so it must be broken up into
     * chunks to enforce the maximmum distance and handle overflow correction.
     */
    assert(sequences->pos <= sequences->size);
    assert(sequences->size <= sequences->capacity);
    for (chunk = 0; chunk < nbChunks && sequences->size < sequences->capacity; ++chunk) {
        BYTE const* const chunkStart = istart + chunk * kMaxChunkSize;
        size_t const remaining = (size_t)(iend - chunkStart);
        BYTE const *const chunkEnd =
            (remaining < kMaxChunkSize) ? iend : chunkStart + kMaxChunkSize;
        size_t const chunkSize = chunkEnd - chunkStart;
        size_t newLeftoverSize;
        size_t const prevSize = sequences->size;

        assert(chunkStart < iend);
        /* 1. Perform overflow correction if necessary. */
        if (ZSTD_window_needOverflowCorrection(ldmState->window, chunkEnd)) {
            U32 const ldmHSize = 1U << params->hashLog;
            U32 const correction = ZSTD_window_correctOverflow(
                &ldmState->window, /* cycleLog */ 0, maxDist, src);
            ZSTD_ldm_reduceTable(ldmState->hashTable, ldmHSize, correction);
        }
        /* 2. We enforce the maximum offset allowed.
         *
         * kMaxChunkSize should be small enough that we don't lose too much of
         * the window through early invalidation.
         * TODO: * Test the chunk size.
         *       * Try invalidation after the sequence generation and test the
         *         the offset against maxDist directly.
         */
        ZSTD_window_enforceMaxDist(&ldmState->window, chunkEnd, maxDist, NULL);
        /* 3. Generate the sequences for the chunk, and get newLeftoverSize. */
        newLeftoverSize = ZSTD_ldm_generateSequences_internal(
            ldmState, sequences, params, chunkStart, chunkSize);
        if (ZSTD_isError(newLeftoverSize))
            return newLeftoverSize;
        /* 4. We add the leftover literals from previous iterations to the first
         *    newly generated sequence, or add the `newLeftoverSize` if none are
         *    generated.
         */
        /* Prepend the leftover literals from the last call */
        if (prevSize < sequences->size) {
            sequences->seq[prevSize].litLength += (U32)leftoverSize;
            leftoverSize = newLeftoverSize;
        } else {
            assert(newLeftoverSize == chunkSize);
            leftoverSize += chunkSize;
        }
    }
    return 0;
}